

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O3

insert_result * __thiscall
crnlib::
hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
::insert(insert_result *__return_storage_ptr__,
        hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        *this,uint *k,uint *v)

{
  uint uVar1;
  uint uVar2;
  raw_node *prVar3;
  uint uVar4;
  raw_node *prVar5;
  uint new_hash_size;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  (__return_storage_ptr__->first).m_pTable = (hash_map_type *)0x0;
  (__return_storage_ptr__->first).m_index = 0;
  __return_storage_ptr__->second = false;
  uVar1 = (this->m_values).m_size;
  if (uVar1 == 0) {
LAB_0017342f:
    new_hash_size = 4;
    if (4 < uVar1 * 2) {
      new_hash_size = uVar1 * 2;
    }
    rehash(this,new_hash_size);
    uVar1 = (this->m_values).m_size;
    if (uVar1 != 0) {
      uVar2 = *k;
      uVar4 = uVar2 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
      prVar3 = (this->m_values).m_p;
      prVar5 = prVar3 + uVar4;
      uVar7 = uVar4;
      if (prVar5->m_bits[8] != '\0') {
        if (*(uint *)prVar5->m_bits == uVar2) goto LAB_00173475;
        uVar6 = uVar1 - 1;
        do {
          bVar8 = uVar7 == 0;
          prVar5 = prVar5 + -1;
          uVar7 = uVar7 - 1;
          if (bVar8) {
            prVar5 = prVar3 + uVar6;
            uVar7 = uVar6;
          }
          if (uVar4 == uVar7) goto LAB_001734d0;
          if (prVar5->m_bits[8] == '\0') goto LAB_001734a9;
        } while (*(uint *)prVar5->m_bits != uVar2);
LAB_001734a1:
        bVar8 = false;
        goto LAB_001734c5;
      }
LAB_001734a9:
      if (this->m_num_valid < this->m_grow_threshold) {
        *(uint *)prVar5->m_bits = uVar2;
        goto LAB_001734b5;
      }
    }
LAB_001734d0:
    crnlib_fail("\"insert() failed\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_hash_map.h"
                ,0x204);
  }
  else {
    uVar2 = *k;
    uVar4 = uVar2 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
    prVar3 = (this->m_values).m_p;
    prVar5 = prVar3 + uVar4;
    uVar7 = uVar4;
    if (prVar5->m_bits[8] == '\0') {
LAB_0017341e:
      if (this->m_grow_threshold <= this->m_num_valid) goto LAB_0017342f;
      *(uint *)prVar5->m_bits = uVar2;
LAB_001734b5:
      *(uint *)(prVar5->m_bits + 4) = *v;
      prVar5->m_bits[8] = '\x01';
      this->m_num_valid = this->m_num_valid + 1;
      bVar8 = true;
    }
    else {
      if (*(uint *)prVar5->m_bits != uVar2) {
        do {
          bVar8 = uVar7 == 0;
          prVar5 = prVar5 + -1;
          uVar7 = uVar7 - 1;
          if (bVar8) {
            prVar5 = prVar3 + (uVar1 - 1);
            uVar7 = uVar1 - 1;
          }
          if (uVar4 == uVar7) goto LAB_0017342f;
          if (prVar5->m_bits[8] == '\0') goto LAB_0017341e;
        } while (*(uint *)prVar5->m_bits != uVar2);
        goto LAB_001734a1;
      }
LAB_00173475:
      bVar8 = false;
    }
LAB_001734c5:
    (__return_storage_ptr__->first).m_pTable = this;
    (__return_storage_ptr__->first).m_index = uVar7;
    __return_storage_ptr__->second = bVar8;
  }
  return __return_storage_ptr__;
}

Assistant:

inline insert_result insert(const Key& k, const Value& v = Value())
        {
            insert_result result;
            if (!insert_no_grow(result, k, v))
            {
                grow();

                // This must succeed.
                if (!insert_no_grow(result, k, v))
                {
                    CRNLIB_FAIL("insert() failed");
                }
            }

            return result;
        }